

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetMetricGroupGetExportDataExpPrologue
          (ZETParameterValidation *this,zet_metric_group_handle_t hMetricGroup,uint8_t *pRawData,
          size_t rawDataSize,size_t *pExportDataSize,uint8_t *pExportData)

{
  ze_result_t zVar1;
  
  if (hMetricGroup == (zet_metric_group_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (pRawData != (uint8_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (pExportDataSize != (size_t *)0x0) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetMetricGroupGetExportDataExpPrologue(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        const uint8_t* pRawData,                        ///< [in] buffer of raw data
        size_t rawDataSize,                             ///< [in] size in bytes of raw data buffer
        size_t* pExportDataSize,                        ///< [in,out] size in bytes of export data buffer
                                                        ///< if size is zero, then the driver shall update the value with the
                                                        ///< number of bytes necessary to store the exported data.
                                                        ///< if size is greater than required, then the driver shall update the
                                                        ///< value with the actual number of bytes necessary to store the exported data.
        uint8_t * pExportData                           ///< [in,out][optional][range(0, *pExportDataSize)] buffer of exported data.
        )
    {
        if( nullptr == hMetricGroup )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pRawData )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pExportDataSize )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }